

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O2

void __thiscall VGMPlayer::Cmd_GGStereo(VGMPlayer *this)

{
  CHIP_DEVICE *pCVar1;
  
  pCVar1 = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,
                        (ulong)this->_fileData[this->_filePos] == 0x3f);
  if ((pCVar1 != (CHIP_DEVICE *)0x0) && (pCVar1->write8 != (DEVFUNC_WRITE_A8D8)0x0)) {
    (*pCVar1->write8)((pCVar1->base).defInf.dataPtr,'\x01',
                      this->_fileData[(ulong)this->_filePos + 1]);
    return;
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_GGStereo(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = (fData[0x00] == 0x3F) ? 1 : 0;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->write8 == NULL)
		return;
	
	cDev->write8(cDev->base.defInf.dataPtr, SN76496_W_GGST, fData[0x01]);
	return;
}